

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

cmSourceFile * __thiscall cmTarget::AddSourceCMP0049(cmTarget *this,string *s)

{
  cmSourceFile *pcVar1;
  string src;
  string local_30;
  
  ProcessSourceItemCMP0049(&local_30,this,s);
  if ((s->_M_string_length == 0) || (local_30._M_string_length != 0)) {
    pcVar1 = AddSource(this,&local_30,false);
  }
  else {
    pcVar1 = (cmSourceFile *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

cmSourceFile* cmTarget::AddSourceCMP0049(const std::string& s)
{
  std::string src = this->ProcessSourceItemCMP0049(s);
  if (!s.empty() && src.empty()) {
    return nullptr;
  }
  return this->AddSource(src);
}